

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::~Iterator(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
            *this)

{
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_RDI;
  
  reset(in_RDI);
  Lib::Stack<Lib::BacktrackData>::~Stack((Stack<Lib::BacktrackData> *)in_RDI);
  Lib::
  Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>
  ::~Stack((Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>
            *)in_RDI);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_>::~Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_> *)
             0x413d07);
  Lib::Stack<unsigned_int>::~Stack((Stack<unsigned_int> *)in_RDI);
  RetrievalAlgorithms::
  UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  ::~UnificationWithAbstraction
            ((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
              *)0x413d1f);
  return;
}

Assistant:

~Iterator()
      { reset(); }